

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libeconf.c
# Opt level: O1

econf_err econf_getKeys(econf_file *kf,char *grp,size_t *length,char ***keys)

{
  size_t __nmemb;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char **ppcVar4;
  char *pcVar5;
  size_t sVar6;
  econf_err eVar7;
  file_entry *pfVar8;
  long lVar9;
  size_t sVar10;
  long lVar11;
  
  if (length != (size_t *)0x0) {
    *length = 0;
  }
  if (kf == (econf_file *)0x0) {
    eVar7 = ECONF_ERROR;
  }
  else {
    if ((grp == (char *)0x0) || (*grp == '\0')) {
      grp = "_none_";
    }
    pcVar2 = strdup(grp);
    if (pcVar2 == (char *)0x0) {
      eVar7 = ECONF_NOMEM;
    }
    else {
      __nmemb = kf->length;
      pcVar3 = (char *)calloc(__nmemb,1);
      eVar7 = ECONF_NOMEM;
      if (pcVar3 != (char *)0x0) {
        if (__nmemb == 0) {
          sVar6 = 0;
        }
        else {
          pfVar8 = kf->file_entry;
          sVar10 = 0;
          sVar6 = 0;
          do {
            iVar1 = strcmp(pfVar8->group,pcVar2);
            if (iVar1 == 0) {
              pcVar3[sVar10] = '\x01';
              sVar6 = sVar6 + 1;
            }
            sVar10 = sVar10 + 1;
            pfVar8 = pfVar8 + 1;
          } while (__nmemb != sVar10);
        }
        free(pcVar2);
        pcVar2 = pcVar3;
        if (sVar6 == 0) {
          eVar7 = ECONF_NOKEY;
        }
        else {
          ppcVar4 = (char **)calloc(sVar6 + 1,8);
          *keys = ppcVar4;
          if (ppcVar4 == (char **)0x0) {
            eVar7 = ECONF_NOMEM;
          }
          else {
            if (__nmemb != 0) {
              lVar9 = 8;
              lVar11 = 0;
              sVar10 = 0;
              do {
                if (pcVar3[sVar10] == '\x01') {
                  pcVar5 = strdup(*(char **)((long)&kf->file_entry->group + lVar9));
                  (*keys)[lVar11] = pcVar5;
                  lVar11 = lVar11 + 1;
                }
                sVar10 = sVar10 + 1;
                lVar9 = lVar9 + 0x38;
              } while (__nmemb != sVar10);
            }
            eVar7 = ECONF_SUCCESS;
            if (length != (size_t *)0x0) {
              *length = sVar6;
            }
          }
        }
      }
      free(pcVar2);
    }
  }
  return eVar7;
}

Assistant:

econf_err
econf_getKeys(econf_file *kf, const char *grp, size_t *length, char ***keys)
{
  if (length != NULL)
    *length = 0; /* initialize */
  if (!kf)
    return ECONF_ERROR;

  size_t tmp = 0;
  char *group = (!grp || !*grp) ? strdup(KEY_FILE_NULL_VALUE) : strdup(grp);
  if (group == NULL)
    return ECONF_NOMEM;

  bool *uniques = calloc(kf->length, sizeof(bool));
  if (uniques == NULL)
    {
      free(group);
      return ECONF_NOMEM;
    }
  for (size_t i = 0; i < kf->length; i++) {
    if (!strcmp(kf->file_entry[i].group, group)) {
      uniques[i] = 1;
      tmp++;
    }
  }
  free(group);
  if (!tmp)
    {
      free (uniques);
      return ECONF_NOKEY;
    }
  *keys = calloc(tmp + 1, sizeof(char*));
  if (*keys == NULL) {
    free (uniques);
    return ECONF_NOMEM;
  }

  for (size_t i = 0, j = 0; i < kf->length; i++)
    if (uniques[i])
      (*keys)[j++] = strdup(kf->file_entry[i].key);

  if (length != NULL)
    *length = tmp;

  free(uniques);
  return ECONF_SUCCESS;
}